

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_d92100::Constructable::~Constructable(Constructable *this)

{
  StringRef macroName;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_60;
  AssertionHandler local_50;
  
  local_60._vptr_ITransientExpression = (_func_int **)0xa29410;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xb;
  capturedExpression.m_start = "constructed";
  Catch::AssertionHandler::AssertionHandler
            (&local_50,macroName,(SourceLineInfo *)&local_60,capturedExpression,ContinueOnFailure);
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb35e0;
  local_60._8_8_ =
       (ulong)CONCAT52(local_60._11_5_,CONCAT11(this->constructed,this->constructed)) << 8;
  Catch::AssertionHandler::handleExpr(&local_50,&local_60);
  Catch::AssertionHandler::complete(&local_50);
  if (local_50.m_completed == false) {
    (*(local_50.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  (anonymous_namespace)::Constructable::numDestructorCalls =
       (anonymous_namespace)::Constructable::numDestructorCalls + 1;
  this->constructed = false;
  this->value = 0;
  return;
}

Assistant:

~Constructable() {
        CHECK(constructed);
        ++numDestructorCalls;
        constructed = false;
        value = 0;
    }